

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::solvePhase1(HEkkPrimal *this)

{
  HEkk *pHVar1;
  bool bVar2;
  HighsDebugStatus HVar3;
  EVP_PKEY_CTX *ctx;
  HEkkPrimal *in_RDI;
  bool in_stack_0000004f;
  string *in_stack_00000050;
  HEkkPrimal *in_stack_00000058;
  bool finished;
  HighsSimplexStatus *status;
  HighsSimplexInfo *info;
  undefined7 in_stack_ffffffffffffff98;
  byte bVar4;
  HEkk *in_stack_ffffffffffffffa8;
  HEkk *in_stack_ffffffffffffffb0;
  allocator local_41;
  HEkkPrimal *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  HEkk *this_00;
  
  this_00 = (HEkk *)&in_RDI->ekk_instance_->info_;
  pHVar1 = in_RDI->ekk_instance_;
  (pHVar1->status_).has_primal_objective_value = false;
  (pHVar1->status_).has_dual_objective_value = false;
  bVar2 = HEkk::bailout(this_00);
  if (!bVar2) {
    highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
                "primal-phase1-start\n");
    if ((*(bool *)((long)&(this_00->analysis_).num_primal_infeasibility + 1) & 1U) == 0) {
      HEkk::putBacktrackingBasis(in_stack_ffffffffffffffb0);
    }
    do {
      rebuild(in_stack_ffffffffffffffc0);
      if (in_RDI->solve_phase == -3) {
        return;
      }
      if (in_RDI->solve_phase == -1) {
        return;
      }
      bVar2 = HEkk::bailout(this_00);
      if (bVar2) {
        return;
      }
      if (in_RDI->solve_phase == 2) break;
      do {
        iterate((HEkkPrimal *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
        bVar2 = HEkk::bailout(this_00);
        if (bVar2) {
          return;
        }
        if (in_RDI->solve_phase == -3) {
          return;
        }
      } while (in_RDI->rebuild_reason == 0);
      bVar4 = 0;
      if ((((pHVar1->status_).has_fresh_rebuild & 1U) != 0) &&
         (bVar4 = 0, in_RDI->num_flip_since_rebuild == 0)) {
        bVar2 = HEkk::rebuildRefactor(in_stack_ffffffffffffffa8,(HighsInt)((ulong)in_RDI >> 0x20));
        bVar4 = bVar2 ^ 0xff;
      }
      in_stack_ffffffffffffffe7 = bVar4 & 1;
      if ((in_stack_ffffffffffffffe7 != 0) &&
         (bVar2 = HEkk::tabooBadBasisChange((HEkk *)CONCAT17(bVar4,in_stack_ffffffffffffff98)),
         bVar2)) {
        in_RDI->solve_phase = 5;
        return;
      }
    } while ((in_stack_ffffffffffffffe7 & 1) == 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"End of solvePhase1",&local_41);
    ctx = (EVP_PKEY_CTX *)&stack0xffffffffffffffc0;
    HVar3 = debugPrimalSimplex(in_stack_00000058,in_stack_00000050,in_stack_0000004f);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (HVar3 == kLogicalError) {
      in_RDI->solve_phase = -3;
    }
    else {
      if ((in_RDI->solve_phase == 1) && (in_RDI->variable_in < 0)) {
        if (((in_RDI->ekk_instance_->info_).bounds_perturbed & 1U) == 0) {
          in_RDI->ekk_instance_->model_status_ = kInfeasible;
          in_RDI->solve_phase = -2;
        }
        else {
          cleanup(in_RDI,ctx);
        }
      }
      if ((in_RDI->solve_phase == 2) &&
         ((*(bool *)((long)&(this_00->analysis_).ftran_upper_sparse_density.limit_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 3) & 1U) == 0)) {
        highsLogDev(&(in_RDI->ekk_instance_->options_->super_HighsOptionsStruct).log_options,
                    kWarning,"Moving to phase 2, but not allowing bound perturbation\n");
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::solvePhase1() {
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  // When starting a new phase the (updated) primal objective function
  // value isn't known. Indicate this so that when the value
  // computed from scratch in build() isn't checked against the
  // updated value
  status.has_primal_objective_value = false;
  status.has_dual_objective_value = false;
  // Possibly bail out immediately if iteration limit is current value
  if (ekk_instance_.bailout()) return;
  highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
              "primal-phase1-start\n");
  // If there's no backtracking basis, save the initial basis in case of
  // backtracking
  if (!info.valid_backtracking_basis_) ekk_instance_.putBacktrackingBasis();

  // Main solving structure
  for (;;) {
    //
    // Rebuild
    //
    // solve_phase = kSolvePhaseError is set if the basis matrix is singular
    rebuild();
    if (solve_phase == kSolvePhaseError) return;
    if (solve_phase == kSolvePhaseUnknown) return;
    if (ekk_instance_.bailout()) return;
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    //
    // solve_phase = kSolvePhase2 is set if no primal infeasibilities
    // are found in rebuild(), in which case return for phase 2
    if (solve_phase == kSolvePhase2) break;

    for (;;) {
      iterate();
      if (ekk_instance_.bailout()) return;
      if (solve_phase == kSolvePhaseError) return;
      assert(solve_phase == kSolvePhase1);
      if (rebuild_reason) break;
    }
    // If the data are fresh from rebuild() and no flips have
    // occurred, possibly break out of the outer loop to see what's
    // occurred
    bool finished = status.has_fresh_rebuild && num_flip_since_rebuild == 0 &&
                    !ekk_instance_.rebuildRefactor(rebuild_reason);
    if (finished && ekk_instance_.tabooBadBasisChange()) {
      // A bad basis change has had to be made taboo without any other
      // basis changes or flips having been performed from a fresh
      // rebuild. In other words, the only basis change that could be
      // made is not permitted, so no definitive statement about the
      // LP can be made.
      solve_phase = kSolvePhaseTabooBasis;
      return;
    }
    if (finished) break;
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  // Will only have accurate simplex info if moving to phase 2 - but
  // should check primal feasibility and residual information if LP
  // is primal infeasible
  if (debugPrimalSimplex("End of solvePhase1") ==
      HighsDebugStatus::kLogicalError) {
    solve_phase = kSolvePhaseError;
    return;
  }
  if (solve_phase == kSolvePhase1) {
    // Determine whether primal infeasibility has been identified
    if (variable_in < 0) {
      // Optimal in phase 1, so should have primal infeasibilities
      assert(info.num_primal_infeasibilities > 0);
      if (ekk_instance_.info_.bounds_perturbed) {
        // Remove any bound perturbations and return to phase 1
        cleanup();
      } else {
        ekk_instance_.model_status_ = HighsModelStatus::kInfeasible;
        solve_phase = kSolvePhaseExit;
      }
    }
  }
  if (solve_phase == kSolvePhase2) {
    // Moving to phase 2 so comment if bound perturbation is not permitted
    //
    // It may have been prevented to avoid cleanup-perturbation loops
    if (!info.allow_bound_perturbation)
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kWarning,
                  "Moving to phase 2, but not allowing bound perturbation\n");
  }
}